

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

string * __thiscall
ast::Binary_expression::get_symbol_abi_cxx11_
          (string *__return_storage_ptr__,Binary_expression *this)

{
  int iVar1;
  Value_type VVar2;
  Value_type VVar3;
  Value_type right_type;
  Value_type left_type;
  Binary_expression *this_local;
  
  iVar1 = this->operation;
  if ((((iVar1 - 0x103U < 8) || (iVar1 - 0x10eU < 3)) || (iVar1 - 0x112U < 2)) ||
     (1 < iVar1 - 0x117U)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    VVar2 = Expression::get_type(this->expression_left);
    VVar3 = Expression::get_type(this->expression_right);
    if ((VVar2 == LABEL) && (VVar3 == ABSOLUTE)) {
      (*this->expression_left->_vptr_Expression[4])(__return_storage_ptr__);
    }
    else if ((VVar2 == ABSOLUTE) && (VVar3 == LABEL)) {
      (*this->expression_right->_vptr_Expression[4])(__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Binary_expression::get_symbol()
{
	switch (operation) {
	case PLUS:
	case MINUS: {
		Value_type left_type = expression_left->get_type();
		Value_type right_type = expression_right->get_type();
		return left_type == LABEL && right_type == ABSOLUTE
				? expression_left->get_symbol()
				: left_type == ABSOLUTE && right_type == LABEL
					? expression_right->get_symbol()
					: string();
	}
	case SHIFT_LEFT:
	case SHIFT_RIGHT:
	case ASTERISK:
	case SLASH:
	case PERCENT:
	case AMPERSAND_AMPERSAND:
	case PIPE_PIPE:
	case PIPE:
	case AMPERSAND:
	case LESSER:
	case GREATER:
	case LESSER_EQUAL:
	case GREATER_EQUAL:
	case EQUAL_EQUAL:
	case NOT_EQUAL:
	case CIRCUMFLEX:
	default:
		return {};
	}
}